

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O1

shared_ptr<kratos::Var> __thiscall kratos::Var::slice_var(Var *this,shared_ptr<kratos::Var> *var)

{
  pointer ppVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  shared_ptr<kratos::Var> sVar2;
  
  (this->super_IRNode)._vptr_IRNode = (in_RDX._M_pi)->_vptr__Sp_counted_base;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppVar1 = *(pointer *)&(in_RDX._M_pi)->_M_use_count;
  (in_RDX._M_pi)->_M_use_count = 0;
  (in_RDX._M_pi)->_M_weak_count = 0;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar1;
  (in_RDX._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Var> slice_var(std::shared_ptr<Var> var) { return var; }